

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O0

void __thiscall menuwindow::drawentry(menuwindow *this,Fl_Menu_Item *m,int n,int eraseit)

{
  Fl_Boxtype FVar1;
  int H;
  char *str;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  Fl_Fontsize local_94;
  Fl_Fontsize local_90;
  Fl_Font local_88;
  Fl_Font local_84;
  Fl_Color local_78;
  char *buf;
  char *s;
  char *k;
  Fl_Font f;
  int x1;
  int y1;
  int sz;
  int hh;
  int yy;
  int ww;
  int W;
  int xx;
  int BW;
  int eraseit_local;
  int n_local;
  Fl_Menu_Item *m_local;
  menuwindow *this_local;
  
  if (m != (Fl_Menu_Item *)0x0) {
    xx = eraseit;
    BW = n;
    _eraseit_local = m;
    m_local = (Fl_Menu_Item *)this;
    FVar1 = Fl_Widget::box((Fl_Widget *)this);
    ww = Fl::box_dx(FVar1);
    W = ww;
    yy = Fl_Widget::w((Fl_Widget *)this);
    iVar4 = yy + W * -2;
    hh = iVar4 + -1;
    sz = W + 1 + BW * this->itemheight;
    y1 = this->itemheight + -4;
    if ((xx != 0) && (BW != this->selected)) {
      fl_push_clip(ww + 1,sz + -1,iVar4 + -3,this->itemheight + -2);
      FVar1 = Fl_Widget::box((Fl_Widget *)this);
      iVar4 = Fl_Widget::w((Fl_Widget *)this);
      H = Fl_Widget::h((Fl_Widget *)this);
      if (button == (Fl_Menu_ *)0x0) {
        local_78 = Fl_Widget::color((Fl_Widget *)this);
      }
      else {
        local_78 = Fl_Widget::color(&button->super_Fl_Widget);
      }
      Fl_Widget::draw_box((Fl_Widget *)this,FVar1,0,0,iVar4,H,local_78);
      fl_pop_clip();
    }
    Fl_Menu_Item::draw(_eraseit_local,ww,sz,hh,y1,button,(uint)(BW == this->selected));
    iVar4 = Fl_Menu_Item::submenu(_eraseit_local);
    if (iVar4 == 0) {
      if (_eraseit_local->shortcut_ != 0) {
        if ((_eraseit_local->labelsize_ == 0) && (_eraseit_local->labelfont_ == 0)) {
          if (button == (Fl_Menu_ *)0x0) {
            local_88 = 0;
          }
          else {
            local_88 = Fl_Menu_::textfont(button);
          }
          local_84 = local_88;
        }
        else {
          local_84 = _eraseit_local->labelfont_;
        }
        k._0_4_ = local_84;
        if (_eraseit_local->labelsize_ == 0) {
          if (button == (Fl_Menu_ *)0x0) {
            local_94 = FL_NORMAL_SIZE;
          }
          else {
            local_94 = Fl_Menu_::textsize(button);
          }
          local_90 = local_94;
        }
        else {
          local_90 = _eraseit_local->labelsize_;
        }
        fl_font(local_84,local_90);
        str = fl_shortcut_label(_eraseit_local->shortcut_,&s);
        pcVar3 = s;
        sVar2 = strlen(s);
        iVar4 = fl_utf_nb_char((uchar *)pcVar3,(int)sVar2);
        if (iVar4 < 5) {
          pcVar3 = (char *)malloc((size_t)(s + (1 - (long)str)));
          memcpy(pcVar3,str,(long)s - (long)str);
          pcVar3[(long)s - (long)str] = '\0';
          fl_draw(pcVar3,ww,sz,hh - this->shortcutWidth,y1,8,(Fl_Image *)0x0,1);
          fl_draw(s,(ww + hh) - this->shortcutWidth,sz,this->shortcutWidth,y1,4,(Fl_Image *)0x0,1);
          free(pcVar3);
        }
        else {
          fl_draw(str,ww,sz,hh + -4,y1,8,(Fl_Image *)0x0,1);
        }
      }
    }
    else {
      x1 = y1 - 7U & 0xfffffffe;
      f = sz + (y1 - x1) / 2;
      iVar4 = (ww + hh) - x1;
      k._4_4_ = iVar4 + -3;
      fl_polygon(iVar4 + -1,f,iVar4 + -1,f + x1,k._4_4_ + x1 / 2 + 2,f + x1 / 2);
    }
    if ((_eraseit_local->flags & 0x80U) != 0) {
      fl_color(0x27);
      fl_xyline(W + -1,sz + y1 + 1,yy + W * -2 + 2);
      fl_color(0x36);
      fl_xyline(W + -1,sz + y1 + 2,yy + W * -2 + 2);
    }
  }
  return;
}

Assistant:

void menuwindow::drawentry(const Fl_Menu_Item* m, int n, int eraseit) {
  if (!m) return; // this happens if -1 is selected item and redrawn

  int BW = Fl::box_dx(box());
  int xx = BW;
  int W = w();
  int ww = W-2*BW-1;
  int yy = BW+1+n*itemheight;
  int hh = itemheight - LEADING;

  if (eraseit && n != selected) {
    fl_push_clip(xx+1, yy-(LEADING-2)/2, ww-2, hh+(LEADING-2));
    draw_box(box(), 0, 0, w(), h(), button ? button->color() : color());
    fl_pop_clip();
  }

  m->draw(xx, yy, ww, hh, button, n==selected);

  // the shortcuts and arrows assume fl_color() was left set by draw():
  if (m->submenu()) {
    int sz = (hh-7)&-2;
    int y1 = yy+(hh-sz)/2;
    int x1 = xx+ww-sz-3;
    fl_polygon(x1+2, y1, x1+2, y1+sz, x1+sz/2+2, y1+sz/2);
  } else if (m->shortcut_) {
    Fl_Font f = m->labelsize_ || m->labelfont_ ? (Fl_Font)m->labelfont_ :
                    button ? button->textfont() : FL_HELVETICA;
    fl_font(f, m->labelsize_ ? m->labelsize_ :
                   button ? button->textsize() : FL_NORMAL_SIZE);
    const char *k, *s = fl_shortcut_label(m->shortcut_, &k);
    if (fl_utf_nb_char((const unsigned char*)k, (int) strlen(k))<=4) {
      // right-align the modifiers and left-align the key
      char *buf = (char*)malloc(k-s+1);
      memcpy(buf, s, k-s); buf[k-s] = 0;
      fl_draw(buf, xx, yy, ww-shortcutWidth, hh, FL_ALIGN_RIGHT);
      fl_draw(  k, xx+ww-shortcutWidth, yy, shortcutWidth, hh, FL_ALIGN_LEFT);
      free(buf);
    } else {
      // right-align to the menu
      fl_draw(s, xx, yy, ww-4, hh, FL_ALIGN_RIGHT);
    }
  }

  if (m->flags & FL_MENU_DIVIDER) {
    fl_color(FL_DARK3);
    fl_xyline(BW-1, yy+hh+(LEADING-2)/2, W-2*BW+2);
    fl_color(FL_LIGHT3);
    fl_xyline(BW-1, yy+hh+((LEADING-2)/2+1), W-2*BW+2);
  }
}